

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O3

bool __thiscall
base::internal::HookList<void_(*)(const_void_*)>::Add
          (HookList<void_(*)(const_void_*)> *this,_func_void_void_ptr *value)

{
  ulong uVar1;
  __int_type _Var2;
  bool bVar3;
  SpinLockHolder local_28;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr *)0x0) {
    bVar3 = false;
  }
  else {
    local_28.lock_ = (SpinLock *)&hooklist_spinlock;
    LOCK();
    bVar3 = hooklist_spinlock == 0;
    if (bVar3) {
      hooklist_spinlock = 1;
    }
    UNLOCK();
    if (!bVar3) {
      SpinLock::SlowLock((SpinLock *)&hooklist_spinlock);
    }
    _Var2 = 1;
    do {
      bVar3 = this->priv_data[_Var2 - 1] == (_func_void_void_ptr *)0x0;
      if (bVar3) {
        uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
        this->priv_data[_Var2 - 1] = value;
        if (uVar1 <= _Var2 - 1) {
          (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var2;
        }
        break;
      }
      _Var2 = _Var2 + 1;
    } while (_Var2 != 8);
    SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return bVar3;
}

Assistant:

bool HookList<T>::Add(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  // Find the first slot in data that is 0.
  int index = 0;
  while ((index < kHookListMaxValues) &&
         cast_priv_data(index)->load(std::memory_order_relaxed) != T{}) {
    ++index;
  }
  if (index == kHookListMaxValues) {
    return false;
  }
  uintptr_t prev_num_hooks = priv_end.load(std::memory_order_acquire);
  cast_priv_data(index)->store(value, std::memory_order_relaxed);
  if (prev_num_hooks <= index) {
    priv_end.store(index + 1, std::memory_order_relaxed);
  }
  return true;
}